

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
::find_or_prepare_insert_non_soo<std::__cxx11::string>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  ushort uVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  undefined8 uVar15;
  undefined1 uVar16;
  bool bVar17;
  ushort uVar18;
  uint64_t uVar19;
  size_t sVar20;
  anon_union_8_1_a8a14541_for_iterator_2 aVar21;
  uint uVar22;
  ctrl_t *pcVar23;
  ulong uVar24;
  bool bVar25;
  undefined7 in_register_00000089;
  ulong uVar26;
  ulong uVar27;
  CommonFields *common;
  long lVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  FindInfo target;
  __m128i match;
  char local_a8;
  char cStack_a7;
  char cStack_a6;
  char cStack_a5;
  char cStack_a4;
  char cStack_a3;
  char cStack_a2;
  char cStack_a1;
  EqualElement<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  pair<std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
  local_58;
  undefined1 local_48 [16];
  
  uVar2 = key->_M_string_length;
  uVar19 = hash_internal::MixingHashState::CombineContiguousImpl
                     (&hash_internal::MixingHashState::kSeed,(key->_M_dataplus)._M_p,uVar2);
  uVar3 = *(ulong *)this;
  if ((uVar3 + 1 & uVar3) != 0) {
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar27 = (uVar19 ^ uVar2) * -0x234dd359734ecb13;
  common = (CommonFields *)
           (uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 | (uVar27 & 0xff0000000000) >> 0x18
            | (uVar27 & 0xff00000000) >> 8 | (uVar27 & 0xff000000) << 8 |
            (uVar27 & 0xff0000) << 0x18 | (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38);
  uVar2 = *(ulong *)(this + 0x10);
  uVar24 = ((ulong)common >> 7 ^ uVar2 >> 0xc) & uVar3;
  uVar16 = (undefined1)(uVar27 >> 0x38);
  auVar29 = ZEXT216(CONCAT11(uVar16,uVar16) & 0x7f7f);
  auVar29 = pshuflw(auVar29,auVar29,0);
  local_48._0_4_ = auVar29._0_4_;
  local_48._4_4_ = local_48._0_4_;
  local_48._8_4_ = local_48._0_4_;
  local_48._12_4_ = local_48._0_4_;
  pcVar23 = (__return_storage_ptr__->first).ctrl_;
  aVar21 = (__return_storage_ptr__->first).field_1;
  bVar25 = __return_storage_ptr__->second;
  uVar27 = 0;
  do {
    pcVar1 = (char *)(uVar2 + uVar24);
    local_a8 = *pcVar1;
    cStack_a7 = pcVar1[1];
    cStack_a6 = pcVar1[2];
    cStack_a5 = pcVar1[3];
    cStack_a4 = pcVar1[4];
    cStack_a3 = pcVar1[5];
    cStack_a2 = pcVar1[6];
    cStack_a1 = pcVar1[7];
    uVar15 = *(undefined8 *)pcVar1;
    cVar7 = pcVar1[8];
    cVar8 = pcVar1[9];
    cVar9 = pcVar1[10];
    cVar10 = pcVar1[0xb];
    cVar11 = pcVar1[0xc];
    cVar12 = pcVar1[0xd];
    cVar13 = pcVar1[0xe];
    cVar14 = pcVar1[0xf];
    auVar29[0] = -(local_48[0] == local_a8);
    auVar29[1] = -(local_48[1] == cStack_a7);
    auVar29[2] = -(local_48[2] == cStack_a6);
    auVar29[3] = -(local_48[3] == cStack_a5);
    auVar29[4] = -(local_48[4] == cStack_a4);
    auVar29[5] = -(local_48[5] == cStack_a3);
    auVar29[6] = -(local_48[6] == cStack_a2);
    auVar29[7] = -(local_48[7] == cStack_a1);
    auVar29[8] = -(local_48[8] == cVar7);
    auVar29[9] = -(local_48[9] == cVar8);
    auVar29[10] = -(local_48[10] == cVar9);
    auVar29[0xb] = -(local_48[0xb] == cVar10);
    auVar29[0xc] = -(local_48[0xc] == cVar11);
    auVar29[0xd] = -(local_48[0xd] == cVar12);
    auVar29[0xe] = -(local_48[0xe] == cVar13);
    auVar29[0xf] = -(local_48[0xf] == cVar14);
    uVar18 = (ushort)(SUB161(auVar29 >> 7,0) & 1) | (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe | (ushort)(auVar29[0xf] >> 7) << 0xf;
    uVar22 = (uint)uVar18;
    while (uVar18 != 0) {
      uVar5 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      uVar26 = uVar5 + uVar24 & uVar3;
      lVar28 = uVar26 * 0x40;
      local_58.second.
      super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      .
      super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
      ._M_head_impl =
           (_Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            )(*(long *)(this + 0x18) + lVar28 + 0x20);
      local_58.first.
      super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      .
      super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
      ._M_head_impl =
           (_Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            )(*(long *)(this + 0x18) + lVar28);
      local_68.rhs = key;
      local_68.eq = (key_equal *)this;
      bVar17 = memory_internal::
               DecomposePairImpl<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>::EqualElement<std::__cxx11::string>,std::__cxx11::string_const&,std::tuple<std::__cxx11::string_const&>>
                         (&local_68,&local_58);
      if (bVar17) {
        (__return_storage_ptr__->first).field_1 = aVar21;
        __return_storage_ptr__->second = bVar25;
        (__return_storage_ptr__->first).ctrl_ = pcVar23;
        if (*(long *)(this + 0x10) != 0) {
          lVar4 = *(long *)(this + 0x18);
          (__return_storage_ptr__->first).ctrl_ = (ctrl_t *)(*(long *)(this + 0x10) + uVar26);
          (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(lVar28 + lVar4);
          __return_storage_ptr__->second = false;
          return __return_storage_ptr__;
        }
        goto LAB_00285b5d;
      }
      uVar18 = (ushort)(uVar22 - 1) & (ushort)uVar22;
      uVar22 = CONCAT22((short)(uVar22 - 1 >> 0x10),uVar18);
      local_a8 = (char)uVar15;
      cStack_a7 = (char)((ulong)uVar15 >> 8);
      cStack_a6 = (char)((ulong)uVar15 >> 0x10);
      cStack_a5 = (char)((ulong)uVar15 >> 0x18);
      cStack_a4 = (char)((ulong)uVar15 >> 0x20);
      cStack_a3 = (char)((ulong)uVar15 >> 0x28);
      cStack_a2 = (char)((ulong)uVar15 >> 0x30);
      cStack_a1 = (char)((ulong)uVar15 >> 0x38);
    }
    auVar30[0] = -(local_a8 == -0x80);
    auVar30[1] = -(cStack_a7 == -0x80);
    auVar30[2] = -(cStack_a6 == -0x80);
    auVar30[3] = -(cStack_a5 == -0x80);
    auVar30[4] = -(cStack_a4 == -0x80);
    auVar30[5] = -(cStack_a3 == -0x80);
    auVar30[6] = -(cStack_a2 == -0x80);
    auVar30[7] = -(cStack_a1 == -0x80);
    auVar30[8] = -(cVar7 == -0x80);
    auVar30[9] = -(cVar8 == -0x80);
    auVar30[10] = -(cVar9 == -0x80);
    auVar30[0xb] = -(cVar10 == -0x80);
    auVar30[0xc] = -(cVar11 == -0x80);
    auVar30[0xd] = -(cVar12 == -0x80);
    auVar30[0xe] = -(cVar13 == -0x80);
    auVar30[0xf] = -(cVar14 == -0x80);
    uVar18 = (ushort)(SUB161(auVar30 >> 7,0) & 1) | (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe | (ushort)(auVar30[0xf] >> 7) << 0xf;
    if (uVar18 == 0) {
      uVar26 = uVar27 + 0x10;
      if (*(ulong *)this < uVar26) {
        (__return_storage_ptr__->first).field_1 = aVar21;
        __return_storage_ptr__->second = bVar25;
        (__return_storage_ptr__->first).ctrl_ = pcVar23;
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xf7d,
                      "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::basic_string<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, std::basic_string<char>>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::basic_string<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, std::basic_string<char>>>, K = std::basic_string<char>]"
                     );
      }
      uVar24 = uVar24 + uVar27 + 0x10 & uVar3;
    }
    else {
      uVar16 = bVar25;
      bVar17 = ShouldInsertBackwardsForDebug
                         (*(size_t *)this,(size_t)common,*(ctrl_t **)(this + 0x10));
      if (bVar17) {
        uVar6 = 0xf;
        if (uVar18 != 0) {
          for (; uVar18 >> uVar6 == 0; uVar6 = uVar6 - 1) {
          }
        }
        uVar22 = (ushort)((uVar6 ^ 0xfff0) + 0x11) - 1;
      }
      else {
        uVar22 = 0;
        if (uVar18 != 0) {
          for (; (uVar18 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
          }
        }
      }
      target.probe_length = (size_t)GetPolicyFunctions()::value;
      target.offset = uVar27;
      sVar20 = PrepareInsertNonSoo((container_internal *)this,common,uVar22 + uVar24 & uVar3,target,
                                   (PolicyFunctions *)CONCAT71(in_register_00000089,uVar16));
      if (*(long *)(this + 0x10) == 0) {
        (__return_storage_ptr__->first).field_1 = aVar21;
        __return_storage_ptr__->second = bVar25;
        (__return_storage_ptr__->first).ctrl_ = pcVar23;
LAB_00285b5d:
        __assert_fail("ctrl != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x9ef,
                      "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::basic_string<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, std::basic_string<char>>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::basic_string<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, std::basic_string<char>>>]"
                     );
      }
      pcVar23 = (ctrl_t *)(*(long *)(this + 0x10) + sVar20);
      aVar21.slot_ = (slot_type *)(sVar20 * 0x40 + *(long *)(this + 0x18));
      bVar25 = true;
      uVar26 = uVar27;
    }
    uVar27 = uVar26;
    if (uVar18 != 0) {
      (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)aVar21;
      __return_storage_ptr__->second = bVar25;
      (__return_storage_ptr__->first).ctrl_ = pcVar23;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      ABSL_SWISSTABLE_ASSERT(seq.index() <= capacity() && "full table!");
    }
  }